

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

void Gia_ManResubTest3(void)

{
  uint uVar1;
  uint *__ptr;
  void *pvVar2;
  Vec_Int_t *p;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  word Truth;
  int *pArray;
  word Divs [6];
  
  Divs[0] = 0;
  Divs[1] = 0;
  Divs[2] = 0xaaaaaaaaaaaaaaaa;
  Divs[3] = 0xcccccccccccccccc;
  Divs[4] = 0xf0f0f0f0f0f0f0f0;
  Divs[5] = 0xff00ff00ff00ff00;
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 8;
  __ptr[1] = 0;
  pvVar2 = malloc(0x40);
  *(void **)(__ptr + 2) = pvVar2;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar3 = (int *)malloc(400);
  p->pArray = piVar3;
  uVar8 = (ulong)(int)__ptr[1];
  uVar1 = *__ptr;
  pvVar2 = *(void **)(__ptr + 2);
  lVar5 = uVar8 * 8;
  lVar6 = 0;
  do {
    if ((uint)uVar8 == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (pvVar2 == (void *)0x0) {
          pvVar2 = malloc(0x80);
        }
        else {
          pvVar2 = realloc(pvVar2,0x80);
        }
        uVar1 = 0x10;
      }
      else {
        uVar7 = uVar1 * 2;
        if (SBORROW4(uVar1,uVar7) != 0 < (int)uVar1) {
          uVar1 = uVar7;
          if (pvVar2 == (void *)0x0) {
            pvVar2 = malloc((ulong)uVar7 << 3);
          }
          else {
            pvVar2 = realloc(pvVar2,(ulong)uVar7 << 3);
          }
        }
      }
    }
    *(long *)((long)pvVar2 + lVar6 + lVar5) = (long)Divs + lVar6;
    lVar6 = lVar6 + 8;
    uVar7 = (uint)uVar8 + 1;
    uVar8 = (ulong)uVar7;
  } while (lVar6 != 0x30);
  __ptr[1] = uVar7;
  *__ptr = uVar1;
  *(void **)(__ptr + 2) = pvVar2;
  Abc_ResubPrepareManager(1);
  uVar8 = 0;
  do {
    Truth = uVar8 * 0x1000100010001;
    Divs[0] = ~Truth;
    Divs[1] = Truth;
    printf("%3d : ",uVar8 & 0xffffffff);
    Extra_PrintHex(_stdout,(uint *)&Truth,4);
    putchar(0x20);
    Dau_DsdPrintFromTruth2(&Truth,4);
    printf("           ");
    uVar1 = Abc_ResubComputeFunction(*(void ***)(__ptr + 2),__ptr[1],1,0x10,0x32,0,0,1,1,&pArray);
    putchar(10);
    piVar3 = pArray;
    p->nSize = 0;
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        Vec_IntPush(p,piVar3[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    bVar9 = uVar8 != 1000;
    uVar8 = uVar8 + 1;
  } while (bVar9);
  if (s_pResbMan != (Gia_ResbMan_t *)0x0) {
    Gia_ResbFree(s_pResbMan);
  }
  s_pResbMan = (Gia_ResbMan_t *)0x0;
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Gia_ManResubTest3()
{
    int nVars = 4;
    int fVerbose = 1;
    word Divs[6] = { 0, 0, 
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00) 
    };
    Vec_Ptr_t * vDivs = Vec_PtrAlloc( 6 );
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    int i, k, ArraySize, * pArray; 
    for ( i = 0; i < 6; i++ )
        Vec_PtrPush( vDivs, Divs+i );
    Abc_ResubPrepareManager( 1 );
    for ( i = 0; i < (1<<(1<<nVars)); i++ ) //if ( i == 0xCA ) 
    {
        word Truth = Abc_Tt6Stretch( i, nVars );
        Divs[0] = ~Truth;
        Divs[1] =  Truth;
        printf( "%3d : ", i );
        Extra_PrintHex( stdout, (unsigned*)&Truth, nVars );
        printf( " " );
        Dau_DsdPrintFromTruth2( &Truth, nVars );
        printf( "           " );

        //Abc_ResubDumpProblem( "temp.resub", (void **)Vec_PtrArray(vDivs), Vec_PtrSize(vDivs), 1 );
        ArraySize = Abc_ResubComputeFunction( (void **)Vec_PtrArray(vDivs), Vec_PtrSize(vDivs), 1, 16, 50, 0, 0, 1, fVerbose, &pArray );
        printf( "\n" );

        Vec_IntClear( vRes );
        for ( k = 0; k < ArraySize; k++ )
            Vec_IntPush( vRes, pArray[k] );

        if ( i == 1000 )
            break;
    }
    Abc_ResubPrepareManager( 0 );
    Vec_IntFree( vRes );
    Vec_PtrFree( vDivs );
}